

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

void __thiscall
mp::VarInfoImpl<mp::VarVecRecomp>::VarInfoImpl
          (VarInfoImpl<mp::VarVecRecomp> *this,double ft,bool recomp_vals,VarVecRecomp *x,
          ArrayRef<double> *x_raw,ArrayRef<mp::var::Type> *type,ArrayRef<double> *lb,
          ArrayRef<double> *ub,int sol_rnd,int sol_prec)

{
  undefined8 in_RCX;
  VarInfoImpl<mp::VarVecRecomp> *in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  ArrayRef<mp::var::Type> *in_R8;
  undefined8 in_XMM0_Qa;
  VarVecRecomp *in_stack_ffffffffffffff58;
  ArrayRef<mp::var::Type> *other;
  VarInfoImpl<mp::VarVecRecomp> *this_00;
  
  *in_RDI = in_XMM0_Qa;
  *(byte *)(in_RDI + 1) = in_SIL & 1;
  this_00 = in_RDX;
  VarVecRecomp::VarVecRecomp((VarVecRecomp *)in_RDX,in_stack_ffffffffffffff58);
  other = (ArrayRef<mp::var::Type> *)(in_RDI + 0xf);
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)in_RDX,(ArrayRef<double> *)in_stack_ffffffffffffff58);
  ArrayRef<mp::var::Type>::ArrayRef(in_R8,other);
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)in_RDX,(ArrayRef<double> *)in_stack_ffffffffffffff58);
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)in_RDX,(ArrayRef<double> *)in_stack_ffffffffffffff58);
  *(undefined4 *)(in_RDI + 0x23) = 100;
  *(undefined4 *)((long)in_RDI + 0x11c) = 100;
  apply_precision_options(this_00,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
  return;
}

Assistant:

VarInfoImpl(double ft, bool recomp_vals,
              VarVec x,
              ArrayRef<double> x_raw,
              ArrayRef<var::Type> type,
              ArrayRef<double> lb, ArrayRef<double> ub,
              int sol_rnd, int sol_prec)
      : feastol_(ft), recomp_vals_(recomp_vals),
      x_(std::move(x)), x_raw_(x_raw),
      type_(type), lb_(lb), ub_(ub) {
    assert((int)x_.size()>=(int)type_.size());  // feasrelax can add more
    assert(type_.size()==lb_.size());
    assert(type_.size()==ub_.size());
    apply_precision_options(sol_rnd, sol_prec); // after recomp?
  }